

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O0

int light_pcapng_validate(light_pcapng p0,uint32_t *p1)

{
  undefined8 uVar1;
  int iVar2;
  uint32_t *__s1;
  uint *in_RSI;
  uint *in_RDI;
  size_t *unaff_retaddr;
  light_pcapng in_stack_00000008;
  uint32_t *mem;
  light_pcapng next_block;
  size_t size;
  int block_count;
  uint32_t *iterator1;
  light_pcapng iterator0;
  uint local_2c;
  uint *local_28;
  uint *local_20;
  
  local_2c = 0;
  local_28 = in_RSI;
  local_20 = in_RDI;
  while( true ) {
    if (local_20 == (uint *)0x0 || local_28 == (uint *)0x0) {
      return 1;
    }
    if ((*local_20 != *local_28) || (local_20[1] != local_28[1])) break;
    uVar1 = *(undefined8 *)(local_20 + 6);
    local_20[6] = 0;
    local_20[7] = 0;
    __s1 = light_pcapng_to_memory(in_stack_00000008,unaff_retaddr);
    iVar2 = memcmp(__s1,local_28,0);
    if (iVar2 != 0) {
      *(undefined8 *)(local_20 + 6) = uVar1;
      free(__s1);
      fprintf(_stderr,"Block contents mismatch!\n");
      return 0;
    }
    free(__s1);
    *(undefined8 *)(local_20 + 6) = uVar1;
    local_20 = *(uint **)(local_20 + 6);
    local_28 = local_28 + (local_28[1] >> 2);
    local_2c = local_2c + 1;
  }
  fprintf(_stderr,"Block type or length mismatch at block %d!\n",(ulong)local_2c);
  fprintf(_stderr,"Expected type: 0x%X == 0x%X and expected length: %u == %u\n",(ulong)*local_20,
          (ulong)*local_28,(ulong)local_20[1],(ulong)local_28[1]);
  return 0;
}

Assistant:

int light_pcapng_validate(light_pcapng p0, uint32_t *p1)
{
	light_pcapng iterator0 = p0;
	uint32_t *iterator1 = p1;
	int block_count = 0;

	while (iterator0 != NULL && iterator1 != NULL) { // XXX find a better stop condition.
		if (iterator0->block_type != iterator1[0] ||
				iterator0->block_total_lenght != iterator1[1]) {
			fprintf(stderr, "Block type or length mismatch at block %d!\n", block_count);
			fprintf(stderr, "Expected type: 0x%X == 0x%X and expected length: %u == %u\n",
					iterator0->block_type, iterator1[0], iterator0->block_total_lenght, iterator1[1]);
			return 0;
		}
		size_t size = 0;
		light_pcapng next_block = iterator0->next_block;
		iterator0->next_block = NULL; // This might be quite intrusive.
		uint32_t *mem = light_pcapng_to_memory(iterator0, &size);
		if (memcmp(mem, iterator1, size) != 0) {
			iterator0->next_block = next_block;
			free(mem);
			fprintf(stderr, "Block contents mismatch!\n");
			return 0;
		}

		free(mem);
		iterator0->next_block = next_block;
		iterator0 = iterator0->next_block;

		iterator1 += iterator1[1] / sizeof(uint32_t);
		block_count++;
	}

	return 1;
}